

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec.cc
# Opt level: O1

int pkey_ec_ctrl(EVP_PKEY_CTX *ctx,int type,int p1,void *p2)

{
  undefined8 *puVar1;
  int iVar2;
  EC_GROUP *pEVar3;
  int line;
  
  puVar1 = (undefined8 *)ctx->data;
  if (type < 3) {
    if (type == 1) {
      iVar2 = EVP_MD_type((EVP_MD *)p2);
      if ((iVar2 - 0x2a0U < 4) || (iVar2 == 0x40)) {
        *puVar1 = p2;
        return 1;
      }
      iVar2 = 0x6f;
      line = 0x88;
      goto LAB_0016cc3e;
    }
    if (type == 2) {
      *(undefined8 *)p2 = *puVar1;
      return 1;
    }
  }
  else {
    if (type == 3) {
      return 1;
    }
    if (type == 0x100d) {
      pEVar3 = EC_GROUP_new_by_curve_name(p1);
      if (pEVar3 != (EC_GROUP *)0x0) {
        puVar1[1] = pEVar3;
        return 1;
      }
      return 0;
    }
  }
  iVar2 = 0x65;
  line = 0xa1;
LAB_0016cc3e:
  ERR_put_error(6,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec.cc"
                ,line);
  return 0;
}

Assistant:

static int pkey_ec_ctrl(EVP_PKEY_CTX *ctx, int type, int p1, void *p2) {
  EC_PKEY_CTX *dctx = reinterpret_cast<EC_PKEY_CTX *>(ctx->data);

  switch (type) {
    case EVP_PKEY_CTRL_MD: {
      const EVP_MD *md = reinterpret_cast<const EVP_MD *>(p2);
      int md_type = EVP_MD_type(md);
      if (md_type != NID_sha1 && md_type != NID_sha224 &&
          md_type != NID_sha256 && md_type != NID_sha384 &&
          md_type != NID_sha512) {
        OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_DIGEST_TYPE);
        return 0;
      }
      dctx->md = md;
      return 1;
    }

    case EVP_PKEY_CTRL_GET_MD:
      *(const EVP_MD **)p2 = dctx->md;
      return 1;

    case EVP_PKEY_CTRL_PEER_KEY:
      // Default behaviour is OK
      return 1;

    case EVP_PKEY_CTRL_EC_PARAMGEN_CURVE_NID: {
      const EC_GROUP *group = EC_GROUP_new_by_curve_name(p1);
      if (group == NULL) {
        return 0;
      }
      dctx->gen_group = group;
      return 1;
    }

    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_COMMAND_NOT_SUPPORTED);
      return 0;
  }
}